

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O1

int mg_session_write_container_size(mg_session *session,uint32_t size,uint8_t *markers)

{
  int iVar1;
  size_t len;
  uint *data;
  undefined1 local_1b [3];
  uint8_t local_18;
  uint8_t local_17;
  ushort local_16;
  uint local_14;
  
  if (size < 0x10) {
    size = (uint32_t)(byte)((char)size + *markers);
    data = (uint *)local_1b;
  }
  else {
    if (0xff < size) {
      if (size < 0x10000) {
        local_18 = markers[2];
        iVar1 = mg_session_write_raw(session,(char *)&local_18,1);
        if (iVar1 != 0) {
          return iVar1;
        }
        local_16 = (ushort)size << 8 | (ushort)size >> 8;
        data = (uint *)&local_16;
        len = 2;
      }
      else {
        local_17 = markers[3];
        iVar1 = mg_session_write_raw(session,(char *)&local_17,1);
        if (iVar1 != 0) {
          return iVar1;
        }
        local_14 = size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18;
        data = &local_14;
        len = 4;
      }
      goto LAB_001082e5;
    }
    local_1b[1] = markers[1];
    iVar1 = mg_session_write_raw(session,local_1b + 1,1);
    if (iVar1 != 0) {
      return iVar1;
    }
    data = (uint *)(local_1b + 2);
  }
  *(char *)data = (char)size;
  len = 1;
LAB_001082e5:
  iVar1 = mg_session_write_raw(session,(char *)data,len);
  return iVar1;
}

Assistant:

int mg_session_write_container_size(mg_session *session, uint32_t size,
                                    const uint8_t *markers) {
  if (size <= MG_TINY_SIZE_MAX) {
    return mg_session_write_uint8(session, (uint8_t)(markers[0] + size));
  }
  if (size <= UINT8_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[1]));
    return mg_session_write_uint8(session, (uint8_t)size);
  }
  if (size <= UINT16_MAX) {
    MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[2]));
    return mg_session_write_uint16(session, (uint16_t)size);
  }
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, markers[3]));
  return mg_session_write_uint32(session, size);
}